

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O2

UndoState * __thiscall
undo::UndoHistory::findCommonParent(UndoHistory *this,UndoState *a,UndoState *b)

{
  UndoState **ppUVar1;
  UndoState *pUVar2;
  UndoState *pA;
  
  pUVar2 = a;
  if (b != (UndoState *)0x0 && a != (UndoState *)0x0) {
    do {
      if (pUVar2 == b) {
        return pUVar2;
      }
      ppUVar1 = &pUVar2->m_parent;
      pUVar2 = *ppUVar1;
    } while ((*ppUVar1 != (UndoState *)0x0) || (b = b->m_parent, pUVar2 = a, b != (UndoState *)0x0))
    ;
  }
  return (UndoState *)0x0;
}

Assistant:

const UndoState* UndoHistory::findCommonParent(const UndoState* a,
                                               const UndoState* b)
{
  const UndoState* pA = a;
  const UndoState* pB = b;

  if (pA == nullptr || pB == nullptr)
    return nullptr;

  while (pA != pB) {
    pA = pA->m_parent;
    if (!pA) {
      pA = a;
      pB = pB->m_parent;
      if (!pB)
        return nullptr;
    }
  }

  return pA;
}